

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrs.cpp
# Opt level: O0

void __thiscall despot::FVRS::FVRS(FVRS *this,string *map)

{
  int iVar1;
  __type _Var2;
  string local_38;
  string *local_18;
  string *map_local;
  FVRS *this_local;
  
  local_18 = map;
  map_local = (string *)this;
  std::__cxx11::string::string((string *)&local_38,(string *)map);
  BaseRockSample::BaseRockSample(&this->super_BaseRockSample,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&this->super_BaseRockSample = &PTR__FVRS_00149a38;
  *(undefined ***)&(this->super_BaseRockSample).super_BeliefMDP = &PTR__FVRS_00149b50;
  *(undefined ***)&(this->super_BaseRockSample).super_StateIndexer = &PTR__FVRS_00149c58;
  *(undefined ***)&(this->super_BaseRockSample).super_StatePolicy = &PTR__FVRS_00149c90;
  iVar1 = (this->super_BaseRockSample).size_;
  _Var2 = std::sqrt<int>(2);
  (this->super_BaseRockSample).half_efficiency_distance_ =
       (((double)(iVar1 + -1) * _Var2) / 4.0) / 2.0;
  return;
}

Assistant:

FVRS::FVRS(string map) :
	BaseRockSample(map) {
	half_efficiency_distance_ = (size_ - 1) * sqrt(2) / 4 / 2;
}